

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

ostream * deqp::gls::ub::operator<<(ostream *str,PrecisionFlagsFmt *fmt)

{
  uint uVar1;
  size_t sVar2;
  bool *__s;
  
  uVar1 = fmt->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 2) == 0) {
      __s = (bool *)0x1bc6bcf;
      if ((uVar1 & 4) == 0) {
        __s = ::glcts::fixed_sample_locations_values + 1;
      }
    }
    else {
      __s = (bool *)0x1bc6bdd;
    }
  }
  else {
    __s = (bool *)0x1c1d2ff;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const PrecisionFlagsFmt& fmt)
{
	// Precision.
	DE_ASSERT(dePop32(fmt.flags & (PRECISION_LOW|PRECISION_MEDIUM|PRECISION_HIGH)) <= 1);
	str << (fmt.flags & PRECISION_LOW		? "lowp"	:
			fmt.flags & PRECISION_MEDIUM	? "mediump"	:
			fmt.flags & PRECISION_HIGH		? "highp"	: "");
	return str;
}